

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

char * strnstr(char *string1,char *string2,size_t len)

{
  int iVar1;
  size_t __n;
  
  __n = strlen(string2);
  if (__n != 0) {
    if (__n <= len) {
      do {
        iVar1 = bcmp(string1,string2,__n);
        if (iVar1 == 0) {
          return string1;
        }
        len = len - 1;
        string1 = string1 + 1;
      } while (__n <= len);
    }
    string1 = (char *)0x0;
  }
  return string1;
}

Assistant:

char* strnstr(const char* string1, const char* string2, size_t len)
{
    size_t length2;

    length2 = strlen(string2);
    if (!length2) {
        return (char*)string1;
    }

    while (len >= length2) {
        len--;
        if (!memcmp(string1, string2, length2))
            return (char*)string1;
        string1++;
    }
    return NULL;
}